

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

int plot_readownertemplate
              (t_plot *x,t_word *data,t_template *ownertemplate,t_symbol **elemtemplatesymp,
              _array **arrayp,t_float *linewidthp,t_float *xlocp,t_float *xincp,t_float *ylocp,
              t_float *stylep,t_float *visp,t_float *scalarvisp,t_float *editp,_fielddesc **xfield,
              _fielddesc **yfield,_fielddesc **wfield)

{
  int iVar1;
  char *pcVar2;
  char *fmt;
  t_float tVar3;
  int type;
  int arrayonset;
  int local_48;
  int local_44;
  _array *local_40;
  t_symbol *local_38;
  
  if (((x->x_data).fd_type == '7') && ((x->x_data).fd_var != '\0')) {
    iVar1 = template_find_field(ownertemplate,(x->x_data).fd_un.fd_symbol,&local_44,&local_48,
                                &local_38);
    if (iVar1 == 0) {
      pcVar2 = ((x->x_data).fd_un.fd_symbol)->s_name;
      fmt = "plot: %s: no such field";
    }
    else {
      if (local_48 == 3) {
        local_40 = *(_array **)((long)data + (long)local_44);
        tVar3 = fielddesc_getfloat(&x->x_width,ownertemplate,data,1);
        *linewidthp = tVar3;
        tVar3 = fielddesc_getfloat(&x->x_xloc,ownertemplate,data,1);
        *xlocp = tVar3;
        tVar3 = fielddesc_getfloat(&x->x_xinc,ownertemplate,data,1);
        *xincp = tVar3;
        tVar3 = fielddesc_getfloat(&x->x_yloc,ownertemplate,data,1);
        *ylocp = tVar3;
        tVar3 = fielddesc_getfloat(&x->x_style,ownertemplate,data,1);
        *stylep = tVar3;
        tVar3 = fielddesc_getfloat(&x->x_vis,ownertemplate,data,1);
        *visp = tVar3;
        tVar3 = fielddesc_getfloat(&x->x_scalarvis,ownertemplate,data,1);
        *scalarvisp = tVar3;
        tVar3 = fielddesc_getfloat(&x->x_edit,ownertemplate,data,1);
        *editp = tVar3;
        *elemtemplatesymp = local_38;
        *arrayp = local_40;
        *xfield = &x->x_xpoints;
        *yfield = &x->x_ypoints;
        *wfield = &x->x_wpoints;
        return 0;
      }
      pcVar2 = ((x->x_data).fd_un.fd_symbol)->s_name;
      fmt = "plot: %s: not an array";
    }
    pd_error((void *)0x0,fmt,pcVar2);
  }
  else {
    pd_error((void *)0x0,"plot: needs an array field");
  }
  return -1;
}

Assistant:

static int plot_readownertemplate(t_plot *x,
    t_word *data, t_template *ownertemplate,
    t_symbol **elemtemplatesymp, t_array **arrayp,
    t_float *linewidthp, t_float *xlocp, t_float *xincp, t_float *ylocp,
    t_float *stylep, t_float *visp, t_float *scalarvisp, t_float *editp,
    t_fielddesc **xfield, t_fielddesc **yfield, t_fielddesc **wfield)
{
    int arrayonset, type;
    t_symbol *elemtemplatesym;
    t_array *array;

        /* find the data and verify it's an array */
    if (x->x_data.fd_type != A_ARRAY || !x->x_data.fd_var)
    {
        pd_error(0, "plot: needs an array field");
        return (-1);
    }
    if (!template_find_field(ownertemplate, x->x_data.fd_un.fd_varsym,
        &arrayonset, &type, &elemtemplatesym))
    {
        pd_error(0, "plot: %s: no such field", x->x_data.fd_un.fd_varsym->s_name);
        return (-1);
    }
    if (type != DT_ARRAY)
    {
        pd_error(0, "plot: %s: not an array", x->x_data.fd_un.fd_varsym->s_name);
        return (-1);
    }
    array = *(t_array **)(((char *)data) + arrayonset);
    *linewidthp = fielddesc_getfloat(&x->x_width, ownertemplate, data, 1);
    *xlocp = fielddesc_getfloat(&x->x_xloc, ownertemplate, data, 1);
    *xincp = fielddesc_getfloat(&x->x_xinc, ownertemplate, data, 1);
    *ylocp = fielddesc_getfloat(&x->x_yloc, ownertemplate, data, 1);
    *stylep = fielddesc_getfloat(&x->x_style, ownertemplate, data, 1);
    *visp = fielddesc_getfloat(&x->x_vis, ownertemplate, data, 1);
    *scalarvisp = fielddesc_getfloat(&x->x_scalarvis, ownertemplate, data, 1);
    *editp = fielddesc_getfloat(&x->x_edit, ownertemplate, data, 1);
    *elemtemplatesymp = elemtemplatesym;
    *arrayp = array;
    *xfield = &x->x_xpoints;
    *yfield = &x->x_ypoints;
    *wfield = &x->x_wpoints;
    return (0);
}